

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  LodePNGDecoderSettings *settings;
  byte *pbVar1;
  LodePNGColorMode *color_00;
  LodePNGInfo *info;
  LodePNGColorMode *dest;
  byte bVar2;
  LodePNGColorType LVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  uchar uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  char *pcVar18;
  ulong uVar19;
  uchar *puVar20;
  size_t sVar21;
  size_t sVar22;
  uchar *puVar23;
  long lVar24;
  ulong uVar25;
  LodePNGInfo *pLVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  size_t bytewidth;
  uint uVar32;
  bool bVar33;
  char *local_338;
  char *local_330;
  LodePNGColorMode *color;
  size_t filter_passstart_1 [8];
  ucvector scanlines;
  ucvector idat;
  ucvector outv;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t local_178 [8];
  size_t local_138 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  
  *out = (uchar *)0x0;
  uVar12 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar12;
  if (uVar12 == 0) {
    lVar29 = (ulong)*h * (ulong)*w;
    uVar12 = (uint)lVar29;
    if (*h == 0) {
      if (uVar12 < 0x10000000) goto LAB_001b82e5;
    }
    else if ((int)((ulong)lVar29 >> 0x20) == 0 && uVar12 < 0x10000000) {
LAB_001b82e5:
      idat.data = (uchar *)0x0;
      idat.size = 0;
      idat.allocsize = 0;
      puVar20 = in + 0x21;
      color_00 = &(state->info_png).color;
      info = &state->info_png;
      settings = &state->decoder;
      iVar15 = 1;
      bVar9 = false;
      bVar33 = false;
LAB_001b8367:
      pbVar1 = puVar20 + 8;
      while ((!bVar33 && (state->error == 0))) {
        if (insize < puVar20 + (0xc - (long)in) || puVar20 < in) {
LAB_001b8ead:
          uVar12 = 0x1e;
LAB_001b8ecb:
          state->error = uVar12;
          break;
        }
        uVar12 = lodepng_read32bitInt(puVar20);
        if ((int)uVar12 < 0) {
          uVar12 = 0x3f;
          goto LAB_001b8ecb;
        }
        uVar31 = (ulong)uVar12;
        if (insize < puVar20 + (0xc - (long)in) + uVar31) {
          uVar12 = 0x40;
          goto LAB_001b8ecb;
        }
        uVar10 = lodepng_chunk_type_equals(puVar20,"IDAT");
        sVar21 = idat.size;
        if (uVar10 == '\0') {
          uVar10 = lodepng_chunk_type_equals(puVar20,"IEND");
          if (uVar10 != '\0') {
            bVar33 = true;
            bVar8 = false;
            goto LAB_001b87a7;
          }
          uVar10 = lodepng_chunk_type_equals(puVar20,"PLTE");
          if (uVar10 != '\0') {
            free((state->info_png).color.palette);
            uVar31 = uVar31 / 3;
            (state->info_png).color.palettesize = uVar31;
            puVar23 = (uchar *)malloc(uVar31 * 4);
            (state->info_png).color.palette = puVar23;
            if ((2 < uVar12) && (puVar23 == (uchar *)0x0)) {
              (state->info_png).color.palettesize = 0;
              goto LAB_001b8ec9;
            }
            if (uVar12 < 0x303) {
              uVar32 = 0;
              uVar12 = 3;
              uVar13 = 2;
              while (uVar31 != uVar32) {
                (state->info_png).color.palette[uVar12 - 3] = pbVar1[uVar13 - 2];
                (state->info_png).color.palette[uVar12 - 2] = pbVar1[uVar13 - 1];
                (state->info_png).color.palette[uVar12 - 1] = pbVar1[uVar13];
                (state->info_png).color.palette[uVar12] = 0xff;
                uVar32 = uVar32 + 1;
                uVar13 = uVar13 + 3;
                uVar12 = uVar12 + 4;
                uVar31 = (state->info_png).color.palettesize;
              }
              iVar15 = 2;
              goto switchD_001b85dd_caseD_1;
            }
LAB_001b8ebd:
            uVar12 = 0x26;
            goto LAB_001b8ecb;
          }
          uVar10 = lodepng_chunk_type_equals(puVar20,"tRNS");
          if (uVar10 == '\0') {
            uVar10 = lodepng_chunk_type_equals(puVar20,"bKGD");
            if (uVar10 != '\0') {
              pLVar26 = info;
              switch(color_00->colortype) {
              case LCT_GREY:
              case LCT_GREY_ALPHA:
                if (uVar12 == 2) {
                  (state->info_png).background_defined = 1;
                  uVar12 = (uint)(ushort)(*(ushort *)(puVar20 + 8) << 8 |
                                         *(ushort *)(puVar20 + 8) >> 8);
LAB_001b8780:
                  (state->info_png).background_b = uVar12;
                  (state->info_png).background_g = uVar12;
                  lVar29 = 0x3c;
                  goto LAB_001b8796;
                }
                uVar12 = 0x2c;
                break;
              default:
                goto switchD_001b85dd_caseD_1;
              case LCT_RGB:
              case LCT_RGBA:
                if (uVar12 == 6) {
                  (state->info_png).background_defined = 1;
                  (state->info_png).background_r =
                       (uint)(ushort)(*(ushort *)(puVar20 + 8) << 8 | *(ushort *)(puVar20 + 8) >> 8)
                  ;
                  (state->info_png).background_g =
                       (uint)(ushort)(*(ushort *)(puVar20 + 10) << 8 |
                                     *(ushort *)(puVar20 + 10) >> 8);
                  uVar12 = (uint)(ushort)(*(ushort *)(puVar20 + 0xc) << 8 |
                                         *(ushort *)(puVar20 + 0xc) >> 8);
                  lVar29 = 0x44;
                  goto LAB_001b8796;
                }
                uVar12 = 0x2d;
                break;
              case LCT_PALETTE:
                if (uVar12 == 1) {
                  (state->info_png).background_defined = 1;
                  uVar12 = (uint)*pbVar1;
                  goto LAB_001b8780;
                }
                uVar12 = 0x2b;
              }
              goto LAB_001b8ecb;
            }
            uVar10 = lodepng_chunk_type_equals(puVar20,"tEXt");
            if (uVar10 == '\0') {
              uVar10 = lodepng_chunk_type_equals(puVar20,"zTXt");
              if (uVar10 == '\0') {
                uVar10 = lodepng_chunk_type_equals(puVar20,"iTXt");
                if (uVar10 == '\0') {
                  uVar10 = lodepng_chunk_type_equals(puVar20,"tIME");
                  if (uVar10 == '\0') {
                    uVar10 = lodepng_chunk_type_equals(puVar20,"pHYs");
                    if (uVar10 == '\0') {
                      if ((puVar20[4] & 0x20) != 0) {
                        bVar8 = true;
                        if ((state->decoder).remember_unknown_chunks != 0) {
                          uVar12 = lodepng_chunk_append
                                             ((state->info_png).unknown_chunks_data + (iVar15 - 1U),
                                              (state->info_png).unknown_chunks_size + (iVar15 - 1U),
                                              puVar20);
                          state->error = uVar12;
                          if (uVar12 != 0) break;
                        }
                        bVar33 = false;
                        bVar9 = true;
                        goto LAB_001b87a7;
                      }
                      uVar12 = 0x45;
                    }
                    else {
                      if (uVar12 == 9) {
                        (state->info_png).phys_defined = 1;
                        uVar12 = *(uint *)(puVar20 + 8);
                        (state->info_png).phys_x =
                             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                             uVar12 << 0x18;
                        uVar12 = *(uint *)(puVar20 + 0xc);
                        (state->info_png).phys_y =
                             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                             uVar12 << 0x18;
                        (state->info_png).phys_unit = (uint)puVar20[0x10];
                        goto switchD_001b85dd_caseD_1;
                      }
                      uVar12 = 0x4a;
                    }
                  }
                  else {
                    if (uVar12 == 7) {
                      (state->info_png).time_defined = 1;
                      (state->info_png).time.year =
                           (uint)(ushort)(*(ushort *)(puVar20 + 8) << 8 |
                                         *(ushort *)(puVar20 + 8) >> 8);
                      (state->info_png).time.month = (uint)puVar20[10];
                      (state->info_png).time.day = (uint)puVar20[0xb];
                      (state->info_png).time.hour = (uint)puVar20[0xc];
                      (state->info_png).time.minute = (uint)puVar20[0xd];
                      (state->info_png).time.second = (uint)puVar20[0xe];
                      goto switchD_001b85dd_caseD_1;
                    }
                    uVar12 = 0x49;
                  }
                  goto LAB_001b8ecb;
                }
                if ((state->decoder).read_text_chunks == 0) goto LAB_001b87a4;
                filter_passstart_1[0] = 0;
                filter_passstart_1[1] = 0;
                filter_passstart_1[2] = 0;
                if (uVar12 < 5) {
                  uVar12 = 0x1e;
                  pcVar18 = (char *)0x0;
                  local_338 = (char *)0x0;
                  local_330 = (char *)0x0;
                  goto LAB_001b8aef;
                }
                for (uVar16 = 0; uVar25 = uVar31, uVar12 != (uint)uVar16; uVar16 = uVar16 + 1) {
                  if (pbVar1[uVar16] == 0) {
                    uVar25 = uVar16 & 0xffffffff;
                    break;
                  }
                }
                iVar7 = (int)uVar25;
                uVar13 = iVar7 + 3;
                if (uVar13 < uVar12) {
                  if (iVar7 - 0x50U < 0xffffffb1) {
                    uVar12 = 0x59;
                    goto LAB_001b8ad4;
                  }
                  pcVar18 = (char *)malloc(uVar25 + 1);
                  if (pcVar18 == (char *)0x0) {
                    uVar12 = 0x53;
                    goto LAB_001b8ad4;
                  }
                  pcVar18[uVar16] = '\0';
                  for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
                    pcVar18[uVar19] = pbVar1[uVar19];
                  }
                  if (puVar20[uVar16 + 10] == '\0') {
                    bVar2 = pbVar1[uVar25 + 1];
                    uVar12 = iVar7 + 5;
                    lVar29 = 0;
                    uVar14 = 0;
                    uVar32 = iVar7 + 4U;
                    for (uVar16 = (ulong)uVar13; (uVar16 < uVar31 && (pbVar1[uVar16] != 0));
                        uVar16 = uVar16 + 1) {
                      uVar14 = uVar14 + 1;
                      uVar32 = uVar32 + 1;
                      lVar29 = lVar29 + 1;
                      uVar12 = uVar12 + 1;
                    }
                    local_338 = (char *)malloc((ulong)(uVar14 + 1));
                    if (local_338 == (char *)0x0) {
                      uVar12 = 0x53;
                      goto LAB_001b8c14;
                    }
                    local_338[uVar14] = '\0';
                    lVar24 = 0;
                    lVar27 = lVar29;
                    while (bVar33 = lVar27 != 0, lVar27 = lVar27 + -1, bVar33) {
                      local_338[lVar24] = pbVar1[uVar13 + (int)lVar24];
                      lVar24 = lVar24 + 1;
                    }
                    for (lVar27 = 0;
                        ((ulong)uVar32 + lVar27 < uVar31 && (pbVar1[lVar27 + (ulong)uVar32] != 0));
                        lVar27 = lVar27 + 1) {
                      uVar12 = uVar12 + 1;
                    }
                    local_330 = (char *)malloc((ulong)((int)lVar27 + 1));
                    if (local_330 == (char *)0x0) {
                      uVar12 = 0x53;
                      goto LAB_001b8c1f;
                    }
                    local_330[lVar27] = '\0';
                    for (lVar24 = 0; lVar27 != lVar24; lVar24 = lVar24 + 1) {
                      local_330[lVar24] = pbVar1[iVar7 + 4U + (int)lVar29 + (int)lVar24];
                    }
                    uVar16 = (ulong)(iVar7 + (int)lVar29 + (int)lVar27 + 5);
                    sVar21 = 0;
                    if (uVar16 <= uVar31) {
                      sVar21 = uVar31 - uVar16;
                    }
                    if (bVar2 == 0) {
                      uVar13 = ucvector_resize((ucvector *)filter_passstart_1,sVar21 + 1);
                      if (uVar13 != 0) {
                        *(undefined1 *)(filter_passstart_1[0] + sVar21) = 0;
                        lVar29 = uVar31 - uVar12;
                        if (uVar31 < uVar12) {
                          lVar29 = 0;
                        }
                        for (lVar27 = 0; lVar29 != lVar27; lVar27 = lVar27 + 1) {
                          *(byte *)(filter_passstart_1[0] + lVar27) = pbVar1[uVar12];
                          uVar12 = uVar12 + 1;
                        }
                        goto LAB_001b8e65;
                      }
                      uVar12 = 0x53;
                    }
                    else {
                      uVar12 = zlib_decompress((uchar **)filter_passstart_1,filter_passstart_1 + 1,
                                               pbVar1 + uVar16,sVar21,&settings->zlibsettings);
                      if (uVar12 == 0) {
                        if (filter_passstart_1[2] < filter_passstart_1[1]) {
                          filter_passstart_1[2] = filter_passstart_1[1];
                        }
                        ucvector_push_back((ucvector *)filter_passstart_1,'\0');
LAB_001b8e65:
                        uVar12 = lodepng_add_itext(info,pcVar18,local_338,local_330,
                                                   (char *)filter_passstart_1[0]);
                      }
                    }
                  }
                  else {
                    uVar12 = 0x48;
LAB_001b8c14:
                    local_338 = (char *)0x0;
LAB_001b8c1f:
                    local_330 = (char *)0x0;
                  }
                }
                else {
                  uVar12 = 0x4b;
LAB_001b8ad4:
                  pcVar18 = (char *)0x0;
                  local_338 = (char *)0x0;
                  local_330 = (char *)0x0;
                }
LAB_001b8aef:
                free(pcVar18);
                free(local_338);
              }
              else {
                if ((state->decoder).read_text_chunks == 0) goto LAB_001b87a4;
                filter_passstart_1[0] = 0;
                filter_passstart_1[1] = 0;
                filter_passstart_1[2] = 0;
                for (lVar29 = 0;
                    (uVar13 = uVar12, uVar12 != (uint)lVar29 &&
                    (uVar13 = (uint)lVar29, pbVar1[lVar29] != 0)); lVar29 = lVar29 + 1) {
                }
                uVar32 = uVar13 + 2;
                if (uVar32 < uVar12) {
                  if (uVar13 - 0x50 < 0xffffffb1) {
                    uVar12 = 0x59;
                  }
                  else {
                    local_330 = (char *)malloc((ulong)uVar13 + 1);
                    if (local_330 != (char *)0x0) {
                      local_330[lVar29] = '\0';
                      for (lVar27 = 0; lVar29 != lVar27; lVar27 = lVar27 + 1) {
                        local_330[lVar27] = pbVar1[lVar27];
                      }
                      if (pbVar1[(ulong)uVar13 + 1] == 0) {
                        uVar12 = zlib_decompress((uchar **)filter_passstart_1,filter_passstart_1 + 1
                                                 ,pbVar1 + uVar32,(ulong)(uVar12 - uVar32),
                                                 &settings->zlibsettings);
                        if (uVar12 == 0) {
                          ucvector_push_back((ucvector *)filter_passstart_1,'\0');
                          uVar12 = lodepng_add_text(info,local_330,(char *)filter_passstart_1[0]);
                        }
                      }
                      else {
                        uVar12 = 0x48;
                      }
                      goto LAB_001b8b03;
                    }
                    uVar12 = 0x53;
                  }
                }
                else {
                  uVar12 = 0x4b;
                }
                local_330 = (char *)0x0;
              }
LAB_001b8b03:
              free(local_330);
              ucvector_cleanup(filter_passstart_1);
            }
            else {
              if ((state->decoder).read_text_chunks == 0) goto LAB_001b87a4;
              for (lVar29 = 0;
                  (uVar13 = uVar12, uVar12 != (uint)lVar29 &&
                  (uVar13 = (uint)lVar29, pbVar1[lVar29] != 0)); lVar29 = lVar29 + 1) {
              }
              if (uVar13 - 0x50 < 0xffffffb1) {
                uVar12 = 0x59;
LAB_001b8900:
                local_338 = (char *)0x0;
                pcVar18 = (char *)0x0;
              }
              else {
                uVar16 = (ulong)(uVar13 + 1);
                pcVar18 = (char *)malloc(uVar16);
                if (pcVar18 == (char *)0x0) {
                  uVar12 = 0x53;
                  goto LAB_001b8900;
                }
                pcVar18[lVar29] = '\0';
                for (lVar27 = 0; lVar29 != lVar27; lVar27 = lVar27 + 1) {
                  pcVar18[lVar27] = pbVar1[lVar27];
                }
                lVar29 = uVar31 - uVar16;
                if (uVar31 < uVar16) {
                  lVar29 = 0;
                }
                local_338 = (char *)malloc(lVar29 + 1);
                if (local_338 == (char *)0x0) {
                  local_338 = (char *)0x0;
                  uVar12 = 0x53;
                }
                else {
                  local_338[lVar29] = '\0';
                  for (lVar27 = 0; lVar29 != lVar27; lVar27 = lVar27 + 1) {
                    local_338[lVar27] = pbVar1[uVar13 + 1 + (int)lVar27];
                  }
                  uVar12 = lodepng_add_text(info,pcVar18,local_338);
                }
              }
              free(pcVar18);
              free(local_338);
            }
            state->error = uVar12;
            if (uVar12 != 0) break;
          }
          else {
            LVar3 = color_00->colortype;
            if (LVar3 != LCT_GREY) {
              if (LVar3 == LCT_RGB) {
                if (uVar12 == 6) {
                  (state->info_png).color.key_defined = 1;
                  (state->info_png).color.key_r =
                       (uint)(ushort)(*(ushort *)(puVar20 + 8) << 8 | *(ushort *)(puVar20 + 8) >> 8)
                  ;
                  (state->info_png).color.key_g =
                       (uint)(ushort)(*(ushort *)(puVar20 + 10) << 8 |
                                     *(ushort *)(puVar20 + 10) >> 8);
                  uVar11 = *(ushort *)(puVar20 + 0xc) << 8 | *(ushort *)(puVar20 + 0xc) >> 8;
                  lVar29 = 0x24;
                  goto LAB_001b8681;
                }
                uVar12 = 0x29;
              }
              else {
                if (LVar3 == LCT_PALETTE) {
                  if ((state->info_png).color.palettesize < uVar31) goto LAB_001b8ebd;
                  pbVar17 = pbVar1;
                  for (uVar16 = 0; uVar31 << 2 != uVar16; uVar16 = uVar16 + 4) {
                    (state->info_png).color.palette[(uVar16 & 0xffffffff) + 3] = *pbVar17;
                    pbVar17 = pbVar17 + 1;
                  }
                  goto switchD_001b85dd_caseD_1;
                }
                uVar12 = 0x2a;
              }
              goto LAB_001b8ecb;
            }
            if (uVar12 != 2) goto LAB_001b8ead;
            (state->info_png).color.key_defined = 1;
            uVar11 = *(ushort *)(puVar20 + 8) << 8 | *(ushort *)(puVar20 + 8) >> 8;
            (state->info_png).color.key_b = (uint)uVar11;
            (state->info_png).color.key_g = (uint)uVar11;
            lVar29 = 0x1c;
LAB_001b8681:
            uVar12 = (uint)uVar11;
            pLVar26 = (LodePNGInfo *)color_00;
LAB_001b8796:
            *(uint *)((long)&pLVar26->compression_method + lVar29) = uVar12;
switchD_001b85dd_caseD_1:
            state->error = 0;
          }
LAB_001b87a4:
          bVar8 = true;
          bVar33 = false;
        }
        else {
          uVar12 = ucvector_resize(&idat,idat.size + uVar31);
          if (uVar12 == 0) {
LAB_001b8ec9:
            uVar12 = 0x53;
            goto LAB_001b8ecb;
          }
          for (uVar16 = 0; uVar31 != uVar16; uVar16 = uVar16 + 1) {
            idat.data[uVar16 + sVar21] = pbVar1[uVar16];
          }
          bVar8 = true;
          bVar33 = false;
          iVar15 = 3;
        }
LAB_001b87a7:
        if (((state->decoder).ignore_crc == 0 && !bVar9) &&
           (uVar12 = lodepng_chunk_check_crc(puVar20), uVar12 != 0)) {
          uVar12 = 0x39;
          goto LAB_001b8ecb;
        }
        if (bVar8) goto LAB_001b8e95;
      }
      scanlines.allocsize = 0;
      scanlines.data = (uchar *)0x0;
      scanlines.size = 0;
      uVar12 = *w;
      if ((state->info_png).interlace_method == 0) {
        uVar13 = *h;
        sVar21 = lodepng_get_raw_size_idat(uVar12,uVar13,color_00);
        sVar21 = sVar21 + uVar13;
      }
      else {
        uVar13 = *h;
        uVar32 = uVar13 + 7 >> 3;
        sVar21 = lodepng_get_raw_size_idat(uVar12 + 7 >> 3,uVar32,color_00);
        lVar29 = sVar21 + uVar32;
        if (4 < uVar12) {
          sVar21 = lodepng_get_raw_size_idat(uVar12 + 3 >> 3,uVar32,color_00);
          lVar29 = lVar29 + (ulong)uVar32 + sVar21;
        }
        uVar32 = uVar13 + 3 >> 3;
        sVar21 = lodepng_get_raw_size_idat(uVar12 + 3 >> 2,uVar32,color_00);
        lVar29 = uVar32 + sVar21 + lVar29;
        if (2 < uVar12) {
          uVar32 = uVar13 + 3 >> 2;
          sVar21 = lodepng_get_raw_size_idat(uVar12 + 1 >> 2,uVar32,color_00);
          lVar29 = lVar29 + uVar32 + sVar21;
        }
        uVar32 = uVar13 + 1 >> 2;
        sVar21 = lodepng_get_raw_size_idat(uVar12 + 1 >> 1,uVar32,color_00);
        lVar29 = uVar32 + sVar21 + lVar29;
        if (1 < uVar12) {
          uVar32 = uVar13 + 1 >> 1;
          sVar21 = lodepng_get_raw_size_idat(uVar12 >> 1,uVar32,color_00);
          lVar29 = lVar29 + uVar32 + sVar21;
        }
        sVar21 = lodepng_get_raw_size_idat(uVar12,uVar13 >> 1,color_00);
        sVar21 = sVar21 + (uVar13 >> 1) + lVar29;
      }
      if (state->error == 0) {
        uVar12 = ucvector_reserve(&scanlines,sVar21);
        if (uVar12 == 0) {
          uVar12 = 0x53;
        }
        else {
          if (state->error != 0) goto LAB_001b90a4;
          uVar13 = zlib_decompress(&scanlines.data,&scanlines.size,idat.data,idat.size,
                                   &settings->zlibsettings);
          uVar12 = 0x5b;
          if (scanlines.size == sVar21) {
            uVar12 = uVar13;
          }
          if (uVar13 != 0) {
            uVar12 = uVar13;
          }
        }
        state->error = uVar12;
      }
LAB_001b90a4:
      ucvector_cleanup(&idat);
      if (state->error != 0) goto LAB_001b94cf;
      sVar21 = lodepng_get_raw_size(*w,*h,color_00);
      outv.data = (uchar *)0x0;
      outv.size = 0;
      outv.allocsize = 0;
      uVar12 = ucvector_resize(&outv,sVar21);
      puVar23 = outv.data;
      puVar20 = scanlines.data;
      if (uVar12 == 0) {
        state->error = 0x53;
        goto LAB_001b94c4;
      }
      for (sVar22 = 0; sVar21 != sVar22; sVar22 = sVar22 + 1) {
        outv.data[sVar22] = '\0';
      }
      if (state->error == 0) {
        uVar12 = *w;
        uVar13 = *h;
        uVar32 = lodepng_get_bpp(color_00);
        if (uVar32 == 0) {
          uVar14 = 0x1f;
        }
        else if ((state->info_png).interlace_method == 0) {
          if (uVar32 < 8) {
            uVar28 = uVar32 * uVar12;
            uVar30 = uVar28 + 7 & 0xfffffff8;
            if (uVar28 != uVar30) {
              uVar14 = unfilter(puVar20,puVar20,uVar12,uVar13,uVar32);
              if (uVar14 == 0) {
                removePaddingBits(puVar23,puVar20,(ulong)uVar28,(ulong)uVar30,uVar13);
                goto LAB_001b94b6;
              }
              goto LAB_001b94b8;
            }
          }
          uVar14 = unfilter(puVar23,puVar20,uVar12,uVar13,uVar32);
          if (uVar14 == 0) goto LAB_001b94b6;
        }
        else {
          Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_138,uVar12,uVar13,
                              uVar32);
          for (lVar29 = 0; lVar29 != 0x1c; lVar29 = lVar29 + 4) {
            lVar27 = *(long *)((long)padded_passstart + lVar29 * 2);
            uVar28 = *(uint *)((long)passw + lVar29);
            uVar30 = *(uint *)((long)passh + lVar29);
            uVar14 = unfilter(puVar20 + lVar27,
                              puVar20 + *(long *)((long)filter_passstart + lVar29 * 2),uVar28,uVar30
                              ,uVar32);
            if (uVar14 != 0) goto LAB_001b94b8;
            if (uVar32 < 8) {
              uVar28 = uVar28 * uVar32;
              removePaddingBits(puVar20 + *(long *)((long)local_138 + lVar29 * 2),puVar20 + lVar27,
                                (ulong)uVar28,(ulong)(uVar28 + 7 & 0xfffffff8),uVar30);
            }
          }
          Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_178,uVar12
                              ,uVar13,uVar32);
          if (uVar32 < 8) {
            for (lVar29 = 0; lVar29 != 7; lVar29 = lVar29 + 1) {
              uVar13 = passw_1[lVar29];
              uVar14 = passh_1[lVar29];
              for (uVar28 = 0; uVar28 != uVar14; uVar28 = uVar28 + 1) {
                for (uVar31 = 0; uVar31 != uVar13; uVar31 = uVar31 + 1) {
                  uVar16 = (ulong)((uVar28 * uVar13 + (int)uVar31) * uVar32) + local_178[lVar29] * 8
                  ;
                  uVar25 = (ulong)((ADAM7_DX[lVar29] * (int)uVar31 + ADAM7_IX[lVar29] +
                                   (ADAM7_DY[lVar29] * uVar28 + ADAM7_IY[lVar29]) * uVar12) * uVar32
                                  );
                  uVar30 = uVar32;
                  while (bVar33 = uVar30 != 0, uVar30 = uVar30 - 1, bVar33) {
                    if ((puVar20[uVar16 >> 3] >> (~(byte)uVar16 & 7) & 1) != 0) {
                      puVar23[uVar25 >> 3] = puVar23[uVar25 >> 3] | '\x01' << (~(byte)uVar25 & 7);
                    }
                    uVar25 = uVar25 + 1;
                    uVar16 = uVar16 + 1;
                  }
                }
              }
            }
          }
          else {
            uVar31 = (ulong)(uVar32 >> 3);
            for (lVar29 = 0; lVar29 != 7; lVar29 = lVar29 + 1) {
              uVar13 = passh_1[lVar29];
              for (uVar32 = 0; uVar32 != uVar13; uVar32 = uVar32 + 1) {
                uVar14 = passw_1[lVar29];
                uVar28 = uVar14 * uVar32;
                for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
                  uVar30 = ADAM7_DX[lVar29];
                  uVar4 = ADAM7_IX[lVar29];
                  uVar5 = ADAM7_DY[lVar29];
                  uVar6 = ADAM7_IY[lVar29];
                  sVar21 = local_178[lVar29];
                  for (uVar25 = 0; uVar31 != uVar25; uVar25 = uVar25 + 1) {
                    puVar23[uVar25 + ((uVar5 * uVar32 + uVar6) * uVar12 +
                                     uVar30 * (int)uVar16 + uVar4) * uVar31] =
                         puVar20[uVar25 + uVar28 * uVar31 + sVar21];
                  }
                  uVar28 = uVar28 + 1;
                }
              }
            }
          }
LAB_001b94b6:
          uVar14 = 0;
        }
LAB_001b94b8:
        state->error = uVar14;
      }
LAB_001b94c4:
      *out = puVar23;
LAB_001b94cf:
      ucvector_cleanup(&scanlines);
      if (state->error != 0) {
        return state->error;
      }
      dest = &state->info_raw;
      if ((state->decoder).color_convert == 0) {
        uVar12 = lodepng_color_mode_copy(dest,color_00);
        state->error = uVar12;
        return uVar12;
      }
      iVar15 = lodepng_color_mode_equal(dest,color_00);
      if (iVar15 != 0) {
        return 0;
      }
      puVar20 = *out;
      if (((dest->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
        return 0x38;
      }
      uVar12 = *w;
      uVar13 = *h;
      sVar21 = lodepng_get_raw_size(uVar12,uVar13,dest);
      puVar23 = (uchar *)malloc(sVar21);
      *out = puVar23;
      if (puVar23 == (uchar *)0x0) {
        uVar12 = 0x53;
      }
      else {
        lodepng_convert(puVar23,puVar20,dest,color_00,uVar12,uVar13);
        uVar12 = 0;
      }
      state->error = uVar12;
      free(puVar20);
      return state->error;
    }
    state->error = 0x5c;
    uVar12 = 0x5c;
  }
  return uVar12;
LAB_001b8e95:
  puVar20 = lodepng_chunk_next_const(puVar20);
  goto LAB_001b8367;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}